

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Expr * sqlite3ExprAddCollateString(Parse *pParse,Expr *pExpr,char *zC)

{
  Expr *pEVar1;
  undefined1 local_30 [8];
  Token s;
  char *zC_local;
  Expr *pExpr_local;
  Parse *pParse_local;
  
  local_30 = (undefined1  [8])zC;
  s._8_8_ = zC;
  s.z._0_4_ = sqlite3Strlen30(zC);
  pEVar1 = sqlite3ExprAddCollateToken(pParse,pExpr,(Token *)local_30);
  return pEVar1;
}

Assistant:

SQLITE_PRIVATE Expr *sqlite3ExprAddCollateString(Parse *pParse, Expr *pExpr, const char *zC){
  Token s;
  assert( zC!=0 );
  s.z = zC;
  s.n = sqlite3Strlen30(s.z);
  return sqlite3ExprAddCollateToken(pParse, pExpr, &s);
}